

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QList<QString> * __thiscall
QMultiMap<QByteArray,_QString>::values
          (QList<QString> *__return_storage_ptr__,QMultiMap<QByteArray,_QString> *this,
          QByteArray *key)

{
  difference_type asize;
  pair<QMultiMap<QByteArray,_QString>::const_iterator,_QMultiMap<QByteArray,_QString>::const_iterator>
  pVar1;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pVar1 = equal_range(this,key);
  asize = std::__distance<QMultiMap<QByteArray,QString>::const_iterator>
                    (pVar1.first.i._M_node.i,pVar1.second.i._M_node.i);
  QList<QString>::reserve(__return_storage_ptr__,asize);
  std::__copy_move<false,false,std::bidirectional_iterator_tag>::
  __copy_m<QMultiMap<QByteArray,QString>::const_iterator,std::back_insert_iterator<QList<QString>>>
            (pVar1.first.i._M_node,pVar1.second.i._M_node,
             (back_insert_iterator<QList<QString>_>)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

QList<T> values(const Key &key) const
    {
        QList<T> result;
        const auto range = equal_range(key);
        result.reserve(std::distance(range.first, range.second));
        std::copy(range.first, range.second, std::back_inserter(result));
        return result;
    }